

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O0

int_fast32_t detzcode(char *codep)

{
  int_fast32_t minval;
  int_fast32_t maxval;
  int_fast32_t halfmaxval;
  int_fast32_t one;
  int i;
  int_fast32_t result;
  char *codep_local;
  
  one = (int)*codep & 0x7f;
  for (halfmaxval = 1; halfmaxval < 4; halfmaxval = halfmaxval + 1) {
    one = one << 8 | (uint)(byte)codep[halfmaxval];
  }
  if (((int)*codep & 0x80U) != 0) {
    one = one + -0x80000000;
  }
  return one;
}

Assistant:

static int_fast32_t detzcode( const char * codep )
{
    int_fast32_t result;
    int          i;
    int_fast32_t one = 1;
    int_fast32_t halfmaxval = one << ( 32 - 2 );
    int_fast32_t maxval = halfmaxval - 1 + halfmaxval;
    int_fast32_t minval = -1 - maxval;

    result = codep[ 0 ] & 0x7f;

    for ( i = 1; i < 4; ++i )
    {
        result = ( result << 8 ) | ( codep[ i ] & 0xff );
    }

    if ( codep[ 0 ] & 0x80 )
    {
        /* Do two's-complement negation even on non-two's-complement machines.
           If the result would be minval - 1, return minval.
        */
        result -= ! _PDCLIB_TWOS_COMPLEMENT && result != 0;
        result += minval;
    }

    return result;
}